

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O0

void __thiscall icu_63::UVector64::setMaxCapacity(UVector64 *this,int32_t limit)

{
  int64_t *piVar1;
  int64_t *newElems;
  int32_t limit_local;
  UVector64 *this_local;
  
  newElems._4_4_ = limit;
  if (limit < 0) {
    newElems._4_4_ = 0;
  }
  if ((((newElems._4_4_ < 0x10000000) &&
       (this->maxCapacity = newElems._4_4_, this->maxCapacity < this->capacity)) &&
      (this->maxCapacity != 0)) &&
     (piVar1 = (int64_t *)uprv_realloc_63(this->elements,(long)this->maxCapacity << 3),
     piVar1 != (int64_t *)0x0)) {
    this->elements = piVar1;
    this->capacity = this->maxCapacity;
    if (this->capacity < this->count) {
      this->count = this->capacity;
    }
  }
  return;
}

Assistant:

void UVector64::setMaxCapacity(int32_t limit) {
    U_ASSERT(limit >= 0);
    if (limit < 0) {
        limit = 0;
    }
    if (limit > (int32_t)(INT32_MAX / sizeof(int64_t))) {  // integer overflow check for realloc
        //  Something is very wrong, don't realloc, leave capacity and maxCapacity unchanged
        return;
    }
    maxCapacity = limit;
    if (capacity <= maxCapacity || maxCapacity == 0) {
        // Current capacity is within the new limit.
        return;
    }
    
    // New maximum capacity is smaller than the current size.
    // Realloc the storage to the new, smaller size.
    int64_t* newElems = (int64_t *)uprv_realloc(elements, sizeof(int64_t)*maxCapacity);
    if (newElems == NULL) {
        // Realloc to smaller failed.
        //   Just keep what we had.  No need to call it a failure.
        return;
    }
    elements = newElems;
    capacity = maxCapacity;
    if (count > capacity) {
        count = capacity;
    }
}